

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O2

string * __thiscall
pbrt::syntactic::Loc::toString_abi_cxx11_(string *__return_storage_ptr__,Loc *this)

{
  element_type *peVar1;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  peVar1 = (this->file).super___shared_ptr<pbrt::syntactic::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (peVar1 == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"<invalid>",&local_f9);
  }
  else {
    std::__cxx11::string::string((string *)&local_f8,(string *)(peVar1 + 8));
  }
  std::operator+(&local_98,"@",&local_f8);
  std::operator+(&local_78,&local_98,":");
  std::__cxx11::to_string(&local_b8,this->line);
  std::operator+(&local_58,&local_78,&local_b8);
  std::operator+(&local_38,&local_58,".");
  std::__cxx11::to_string(&local_d8,this->col);
  std::operator+(__return_storage_ptr__,&local_38,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_f8);
  return __return_storage_ptr__;
}

Assistant:

std::string toString() const {
        return "@" + (file?file->getFileName():"<invalid>") + ":" + std::to_string(line) + "." + std::to_string(col);
      }